

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

Vector2 MeasureTextEx(Font font,char *text,float fontSize,float spacing)

{
  float fVar1;
  int local_4c;
  int local_48;
  int next;
  int i;
  int index;
  int letter;
  float scaleFactor;
  float textHeight;
  float tempTextWidth;
  float textWidth;
  int lenCounter;
  int tempLen;
  int len;
  float spacing_local;
  float fontSize_local;
  char *text_local;
  Vector2 vec;
  
  tempLen = (int)spacing;
  len = (int)fontSize;
  _spacing_local = text;
  lenCounter = TextLength(text);
  textWidth = 0.0;
  tempTextWidth = 0.0;
  textHeight = 0.0;
  scaleFactor = 0.0;
  letter = (int)(float)font.baseSize;
  index = (int)((float)len / (float)font.baseSize);
  i = 0;
  next = 0;
  local_48 = 0;
  while (local_48 < lenCounter) {
    tempTextWidth = (float)((int)tempTextWidth + 1);
    local_4c = 0;
    i = GetNextCodepoint(_spacing_local + local_48,&local_4c);
    next = GetGlyphIndex(font,i);
    if (i == 0x3f) {
      local_4c = 1;
    }
    local_48 = local_4c + local_48;
    if (i == 10) {
      if (scaleFactor < textHeight) {
        scaleFactor = textHeight;
      }
      tempTextWidth = 0.0;
      textHeight = 0.0;
      letter = (int)((float)font.baseSize * 1.5 + (float)letter);
    }
    else {
      if (font.chars[next].advanceX == 0) {
        fVar1 = font.recs[next].width + (float)font.chars[next].offsetX;
      }
      else {
        fVar1 = (float)font.chars[next].advanceX;
      }
      textHeight = fVar1 + textHeight;
    }
    if ((int)textWidth < (int)tempTextWidth) {
      textWidth = tempTextWidth;
    }
  }
  if (scaleFactor < textHeight) {
    scaleFactor = textHeight;
  }
  text_local = (char *)CONCAT44((float)letter * (float)index,
                                scaleFactor * (float)index +
                                (float)((int)textWidth + -1) * (float)tempLen);
  return (Vector2)text_local;
}

Assistant:

Vector2 MeasureTextEx(Font font, const char *text, float fontSize, float spacing)
{
    int len = TextLength(text);
    int tempLen = 0;                // Used to count longer text line num chars
    int lenCounter = 0;

    float textWidth = 0.0f;
    float tempTextWidth = 0.0f;     // Used to count longer text line width

    float textHeight = (float)font.baseSize;
    float scaleFactor = fontSize/(float)font.baseSize;

    int letter = 0;                 // Current character
    int index = 0;                  // Index position in sprite font

    for (int i = 0; i < len; i++)
    {
        lenCounter++;

        int next = 0;
        letter = GetNextCodepoint(&text[i], &next);
        index = GetGlyphIndex(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) next = 1;
        i += next - 1;

        if (letter != '\n')
        {
            if (font.chars[index].advanceX != 0) textWidth += font.chars[index].advanceX;
            else textWidth += (font.recs[index].width + font.chars[index].offsetX);
        }
        else
        {
            if (tempTextWidth < textWidth) tempTextWidth = textWidth;
            lenCounter = 0;
            textWidth = 0;
            textHeight += ((float)font.baseSize*1.5f); // NOTE: Fixed line spacing of 1.5 lines
        }

        if (tempLen < lenCounter) tempLen = lenCounter;
    }

    if (tempTextWidth < textWidth) tempTextWidth = textWidth;

    Vector2 vec = { 0 };
    vec.x = tempTextWidth*scaleFactor + (float)((tempLen - 1)*spacing); // Adds chars spacing to measure
    vec.y = textHeight*scaleFactor;

    return vec;
}